

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<float>::TPZVec(TPZVec<float> *this,initializer_list<float> *list)

{
  ulong uVar1;
  iterator pfVar2;
  float *pfVar3;
  long lVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  this->fStore = (float *)0x0;
  uVar1 = list->_M_len;
  if (uVar1 != 0) {
    pfVar3 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    this->fStore = pfVar3;
    pfVar2 = list->_M_array;
    pfVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar3 + lVar4) = *(undefined4 *)((long)pfVar2 + lVar4);
      lVar4 = lVar4 + 4;
    } while (uVar1 * 4 - lVar4 != 0);
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}